

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O0

void __thiscall tonk::Connection::onAckSendTimer(Connection *this,uint64_t nowUsec)

{
  bool bVar1;
  Result *in_RSI;
  long in_RDI;
  uint64_t owdUsec;
  uint intervalUsec;
  Result result;
  SessionIncoming *in_stack_00000568;
  uint32_t in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 uVar2;
  uint local_30;
  long local_20;
  long lVar3;
  
  lVar3 = in_RDI;
  SessionIncoming::PostAcknowledgements(in_stack_00000568);
  if (local_20 != 0) {
    RefCounter::StartShutdown
              ((RefCounter *)&stack0xffffffffffffffe0,(uint)((ulong)lVar3 >> 0x20),in_RSI);
  }
  local_30 = 50000;
  bVar1 = TimeSynchronizer::IsSynchronized((TimeSynchronizer *)0x13bf30);
  uVar2 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffb4);
  if (bVar1) {
    in_stack_ffffffffffffffb0 =
         TimeSynchronizer::GetMinimumOneWayDelayUsec((TimeSynchronizer *)0x13bf51);
    local_30 = in_stack_ffffffffffffffb0 >> 1;
  }
  if (local_30 < 50000) {
    local_30 = 50000;
  }
  Timer::SetTimeoutUsec((Timer *)(in_RDI + 0xc828),(ulong)local_30,Stop);
  Timer::Start((Timer *)(in_RDI + 0xc828),(uint64_t)in_RSI);
  Result::~Result((Result *)CONCAT44(uVar2,in_stack_ffffffffffffffb0));
  return;
}

Assistant:

void Connection::onAckSendTimer(uint64_t nowUsec)
{
    Result result = Incoming.PostAcknowledgements();
    if (result.IsFail()) {
        SelfRefCount.StartShutdown(Tonk_FECFailed, result);
    }

    // Find latest flow control interval
    unsigned intervalUsec = protocol::kMinAckIntervalUsec;
    if (TimeSync.IsSynchronized())
    {
        // Otherwise send up to two acknowledgements per OWD, in case one gets lost.
        // If the data rate is very low, Ack-Acks will stop us from sending a ton of Acks.
        const uint64_t owdUsec = TimeSync.GetMinimumOneWayDelayUsec();
        intervalUsec = static_cast<unsigned>(owdUsec) / 2;
    }
    if (intervalUsec < protocol::kMinAckIntervalUsec) {
        intervalUsec = protocol::kMinAckIntervalUsec;
    }

    AcknowledgementTimer.SetTimeoutUsec(intervalUsec);
    AcknowledgementTimer.Start(nowUsec);
}